

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval_heap.hpp
# Opt level: O3

void boost::heap::interval_heap_internal::
     sift_up<true,__gnu_cxx::__normal_iterator<(anonymous_namespace)::ThrowingElement*,std::vector<(anonymous_namespace)::ThrowingElement,std::allocator<(anonymous_namespace)::ThrowingElement>>>,long,std::less<(anonymous_namespace)::ThrowingElement>>
               (long first,ulong origin)

{
  bool bVar1;
  ThrowingElement *extraout_RDX;
  ThrowingElement *__y;
  ThrowingElement *extraout_RDX_00;
  ulong uVar2;
  Value limbo;
  ThrowingElement __tmp;
  ThrowingElement local_40 [2];
  
  anon_unknown.dwarf_166b40::ThrowingElement::ThrowingElement
            (local_40,(ThrowingElement *)(ulong)*(uint *)(first + origin * 8));
  __y = extraout_RDX;
  while (1 < (long)origin) {
    uVar2 = (origin >> 1) - 1 & 0xfffffffffffffffe;
    bVar1 = std::less<(anonymous_namespace)::ThrowingElement>::operator()
                      ((less<(anonymous_namespace)::ThrowingElement> *)
                       (ulong)(uint)local_40[0].value,
                       (ThrowingElement *)(ulong)*(uint *)(first + uVar2 * 8),__y);
    if (!bVar1) break;
    anon_unknown.dwarf_166b40::ThrowingElement::operator=
              ((ThrowingElement *)(first + origin * 8),
               (ThrowingElement *)(ulong)*(uint *)(first + uVar2 * 8));
    __y = extraout_RDX_00;
    origin = uVar2;
  }
  anon_unknown.dwarf_166b40::ThrowingElement::operator=
            ((ThrowingElement *)(first + origin * 8),
             (ThrowingElement *)(ulong)(uint)local_40[0].value);
  return;
}

Assistant:

void sift_up (Iterator first, Offset origin, Compare compare,Offset limit_child)
{
//  Use the most specialized available functions.
  using namespace std;
  typedef typename iterator_traits<Iterator>::value_type Value;
//  Keeping the information about the origin permits strong exception guarantee.
  Offset index = origin;
#if (__cplusplus >= 201103L)  //  C++11
//  Float element in limbo while sifting it up the heap.
  Value limbo = std::move_if_noexcept(*(first + index));
#endif
//  Provides strong exception-safety guarantee (rollback), unless move throws.
  try {
    while (index >= limit_child) {
      const Offset parent = ((index / 2 - 1) | 1) ^ (left_bound ? 1 : 0);
#if (__cplusplus >= 201103L)  //  C++11
      if (compare((left_bound ? limbo : *(first + parent)),
                  (left_bound ? *(first + parent) : limbo))) {
        *(first + index) = std::move_if_noexcept(*(first + parent));
#else
      if (compare(*(first + (left_bound ? index : parent)),
                  *(first + (left_bound ? parent : index)))) {
        swap(*(first + index), *(first + parent));
#endif
        index = parent;
      } else
        break;
    }
  } catch (...) { //  Provides strong exception-safety guarantee.
//  I need limbo because elements are being moved in the direction of travel.
#if (__cplusplus < 201103L)  //  Not C++11. Need to allocate limbo.
    Value limbo;
    swap(*(first + index), limbo);
#endif
    swap(*(first + origin), limbo);
    while (origin > index) {
      origin = ((origin / 2 - 1) | 1) ^ (left_bound ? 1 : 0);
      swap(*(first + origin), limbo);
    }
    throw;  //  Re-throw the current exception.
  }
#if (__cplusplus >= 201103L)  //  C++11
//  Done sifting. Get the element out of limbo.
  *(first + index) = std::move_if_noexcept(limbo);
#endif
}

//! @remark Exception safety: As strong as sift_up.
//! @pre @a index refers to a leaf node of the heap.
template <typename Iterator, typename Offset, typename Compare>
void sift_leaf_max (Iterator first, Iterator last, Offset index,
                    Compare compare, Offset limit_child)
{
//  Use the most specialized swap function.
  using namespace std;
  const Offset index_end = last - first;


//  Index of corresponding left-bound (min) element
  const Offset co_index = ((index_end - 1) / 2 < index)
                            ? (index ^ 1) : (index * 2);
  if (compare(*(first + index), *(first + co_index))) {
    typedef interval_heap_internal::RAIISwapper<typename std::iterator_traits<Iterator>::value_type> guard_t;
#if (__cplusplus >= 201103L)
    guard_t scope_guard (std::addressof(*(first + index)), std::addressof(*(first + co_index)));
#else
    guard_t scope_guard (&(*(first + index)), &(*(first + co_index)));
#endif
    swap(*scope_guard.ptr1_, *scope_guard.ptr2_);
    sift_up<true, Iterator, Offset, Compare>(first, co_index, compare,
                                             limit_child);
    scope_guard.disable();
  } else
    sift_up<false, Iterator, Offset, Compare>(first, index, compare,
                                              limit_child);
}

//! @remark Exception safety: As strong as sift_up.
//! @pre @a index refers to a leaf node of the heap.
template <typename Iterator, typename Offset, typename Compare>
void sift_leaf_min (Iterator first, Iterator last, Offset index,
                    Compare compare, Offset limit_child)
{
//  Use the most specialized swap function.
  using namespace std;
  const Offset index_end = last - first;

//  Index of corresponding element (initial assumption)
  Offset co_index = index | 1;
//  Co-index is past the end of the heap. Move to its parent, if possible.
  if (co_index >= index_end) {
//  Only one element.
    if (co_index == 1)
      return;
    co_index = (co_index / 2 - 1) | 1;
  }
  if (compare(*(first + co_index), *(first + index))) {
    typedef interval_heap_internal::RAIISwapper<typename std::iterator_traits<Iterator>::value_type> guard_t;
#if (__cplusplus >= 201103L)
    guard_t scope_guard (std::addressof(*(first + index)), std::addressof(*(first + co_index)));
#else
    guard_t scope_guard (&(*(first + index)), &(*(first + co_index)));
#endif
    swap(*scope_guard.ptr1_, *scope_guard.ptr2_);
    sift_up<false, Iterator, Offset, Compare>(first, co_index, compare,
                                              limit_child);
    scope_guard.disable();
  } else
    sift_up<true, Iterator, Offset, Compare>(first, index, compare,limit_child);
}

//! @remark Exception safety: As strong as sift_up.
template <bool left_bound, typename Iterator, typename Offset, typename Compare>
void sift_down (Iterator first, Iterator last, Offset origin, Compare compare,
                Offset limit_child)
{
//  Use the most specialized available functions.
  using namespace std;

//  By keeping track of where I started, I can roll back all changes.
  Offset index = origin;
#if (__cplusplus >= 201103L)  //  C++11
  typedef typename iterator_traits<Iterator>::value_type Value;
  Value limbo = std::move_if_noexcept(*(first + index));
#endif

  const Offset index_end = last - first;
//  One past the last element with two children.
  const Offset end_parent = index_end / 2 -
                              ((left_bound && ((index_end & 3) == 0)) ? 2 : 1);
  try { //  This try-catch block rolls back after exceptions.
    while (index < end_parent) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
//  If compare throws, heap property cannot be verified or enforced.
      try { //  This try-catch block ensures no element is left in limbo.
        if (compare(*(first + child + (left_bound ? 2 : 0)),
                    *(first + child + (left_bound ? 0 : 2))))
          child += 2;
      } catch (...) {
#if (__cplusplus >= 201103L)  //  C++11
//  Pull the moving element out of limbo, to avoid leaks.
        *(first + index) = std::move_if_noexcept(limbo);
#endif
        throw;  //  Re-throw the current exception.
      }
#if (__cplusplus >= 201103L)  //  C++11
      *(first + index) = std::move_if_noexcept(*(first + child));
#else
      swap(*(first + index), *(first + child));
#endif
      index = child;
    }
//  Special case when index has exactly one child.
    if (index <= end_parent + (left_bound ? 0 : 1)) {
      Offset child = index * 2 + (left_bound ? 2 : 1);
      if (child < index_end) {
        const Offset cochild = child + 1;
//  Need to treat singletons (child + 1) as both upper and lower bounds.
        if (!left_bound && (cochild != index_end)) {
//  Calculating this outside the if-statement simplifies exception-handling.
          bool swap_required;
          try {
            swap_required = compare(*(first + child), *(first + cochild));
          } catch (...) {
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)
            *(first + index) = std::move_if_noexcept(limbo);
#endif
            throw;  //  Re-throw the current exception.
          }
          if (swap_required) {
            //++child;
#if (__cplusplus >= 201103L)  //  C++11
            *(first + index) = std::move_if_noexcept(*(first + cochild));
            *(first + cochild) = std::move_if_noexcept(limbo);
#else
            swap(*(first + index), *(first + cochild));
#endif
            index = cochild;  //  Important for the rollback.
            sift_leaf_min<Iterator, Offset, Compare>(first, last, index,
                                                     compare, limit_child);
            return;
          }
        }
#if (__cplusplus >= 201103L)  //  C++11
        *(first + index) = std::move_if_noexcept(*(first + child));
#else
        swap(*(first + index), *(first + child));
#endif
        index = child;
      }
    }
//  Pull the moving element out of limbo.
#if (__cplusplus >= 201103L)  //  C++11
    *(first + index) = std::move_if_noexcept(limbo);
#endif
    if (left_bound)
      sift_leaf_min<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
    else
      sift_leaf_max<Iterator, Offset, Compare>(first, last, index, compare,
                                               limit_child);
  } catch (...) {
//  Rolls back comparison exceptions. Move exceptions can't be reliably fixed.
    while (index > origin) {
      const Offset parent = ((index / 2 - 1) | 1) ^ (left_bound ? 1 : 0);
      swap(*(first + parent), *(first + index));
      index = parent;
    }
    throw;  //  Re-throw the current exception.
  }
}

//! @remark Exception safety: As strong as sift_up.
template <typename Iterator, typename Compare>
void sift_leaf (Iterator first, Iterator last,
                typename std::iterator_traits<Iterator>::difference_type index,
                Compare compare)
{
  using namespace std;
  typedef typename iterator_traits<Iterator>::difference_type Offset;
  if (index & 1)
    sift_leaf_max<Iterator, Offset, Compare>(first, last, index, compare, 2);
  else
    sift_leaf_min<Iterator, Offset, Compare>(first, last, index, compare, 2);
}
}